

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MANU.cpp
# Opt level: O2

bool check(int i)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  iVar1 = local_time();
  iVar2 = ITEM[i].manu;
  iVar7 = ITEM[i].span;
  uVar5 = 0x1e;
  iVar4 = (iVar7 % 0x16d) / 0x1e;
  uVar3 = iVar2 / 10000 + iVar7 / 0x16d;
  uVar6 = (short)((short)((long)iVar2 % 10000) / 100) + iVar4;
  iVar2 = iVar2 % 100 + iVar7 + iVar4 * -10;
  if (uVar6 < 0xd) {
    if ((0x15aaU >> (uVar6 & 0x1f) & 1) == 0) {
      if (uVar6 == 2) {
        uVar5 = ((int)uVar3 % 100 == 0 || (uVar3 & 3) != 0) ^ 0x1d;
      }
    }
    else {
      uVar5 = 0x1f;
    }
  }
  iVar7 = uVar6 + ((int)uVar5 < iVar2);
  if (iVar1 / 10000 <= (int)(uVar3 + (0xc < iVar7))) {
    iVar4 = iVar7 + -0xc;
    if (iVar7 < 0xd) {
      iVar4 = iVar7;
    }
    uVar3 = 0;
    if ((int)uVar5 < iVar2) {
      uVar3 = uVar5;
    }
    if (((short)((short)((long)iVar1 % 10000) / 100) <= iVar4) &&
       (iVar1 % 100 <= (int)(iVar2 - uVar3))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool check(int i) {
    int now = local_time(), sy = ITEM[i].span / 365,
            sm = (ITEM[i].span - sy * 365) / 30, sd = ITEM[i].span - sm * 10,
            my = ITEM[i].manu / 10000, mm = (ITEM[i].manu % 10000) / 100,
            md = ITEM[i].manu % 100, dmax;
    bool ok = true;

    my += sy;
    mm += sm;
    md += sd;
    switch (mm) {
        case 2:
            if (my % 4 || !(my % 100)) {
                dmax = 28;
            } else {
                dmax = 29;
            }
            break;
        case 4:
        case 6:
        case 9:
        case 11:
            dmax = 30;
            break;
        case 1:
        case 3:
        case 5:
        case 7:
        case 8:
        case 10:
        case 12:
            dmax = 31;
    }
    if(md > dmax) {
        mm++;
        md -= dmax;
    }
    if(mm > 12) {
        my++;
        mm -= 12;
    }
    if (now / 10000 > my || (now % 10000) / 100 > mm || now % 100 > md) {
        ok = false;
    }
    return ok;
}